

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformCreateSecretOptions
          (Transformer *this,CreateSecretInfo *info,
          optional_ptr<duckdb_libpgquery::PGList,_true> options)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_01
  ;
  undefined1 auVar1 [8];
  Transformer *pTVar2;
  undefined8 uVar3;
  bool bVar4;
  PGList *pPVar5;
  PGDefElem *pPVar6;
  pointer pPVar7;
  type pPVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  BinderException *this_02;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var11;
  undefined1 local_120 [8];
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  Transformer *local_100;
  __node_base local_f8;
  case_insensitive_map_t<vector<ParsedExpression>_> vector_options;
  undefined1 local_b8 [64];
  optional_ptr<duckdb_libpgquery::PGList,_true> options_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string lower_name;
  
  if (options.ptr != (PGList *)0x0) {
    options_local = options;
    pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&options_local);
    local_f8._M_nxt = (_Hash_node_base *)&info->options;
    this_00 = &info->provider;
    this_01 = &info->type;
    while (pPVar5 = (PGList *)pPVar5->head, pPVar5 != (PGList *)0x0) {
      def_elem.ptr = *(PGDefElem **)pPVar5;
      pPVar6 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string
                ((string *)local_b8,pPVar6->defname,(allocator *)&vector_options);
      StringUtil::Lower(&lower_name,(string *)local_b8);
      ::std::__cxx11::string::~string((string *)local_b8);
      bVar4 = ::std::operator==(&lower_name,"scope");
      if (bVar4) {
        optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
        TransformExpression((Transformer *)local_b8,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        uVar3 = local_b8._0_8_;
        local_b8._0_8_ = (Transformer *)0x0;
        _Var11._M_head_impl =
             (info->scope).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (info->scope).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar3;
        if (_Var11._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
          if ((Transformer *)local_b8._0_8_ != (Transformer *)0x0) {
            (*((BaseExpression *)local_b8._0_8_)->_vptr_BaseExpression[1])();
          }
        }
      }
      else {
        bVar4 = ::std::operator==(&lower_name,"type");
        if (bVar4) {
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
          TransformExpression((Transformer *)local_b8,
                              (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
          uVar3 = local_b8._0_8_;
          local_b8._0_8_ = (Transformer *)0x0;
          _Var11._M_head_impl =
               (this_01->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (this_01->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)uVar3;
          if (_Var11._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
            if ((Transformer *)local_b8._0_8_ != (Transformer *)0x0) {
              (*((BaseExpression *)local_b8._0_8_)->_vptr_BaseExpression[1])();
            }
          }
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_01);
          if ((pPVar7->super_BaseExpression).type == COLUMN_REF) {
            pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator*(this_01);
            GetConstantExpressionValue((Value *)local_b8,pPVar8);
            make_uniq<duckdb::ConstantExpression,duckdb::Value>
                      ((duckdb *)&vector_options,(Value *)local_b8);
            _Var11._M_head_impl =
                 (this_01->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_01->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)vector_options._M_h._M_buckets;
LAB_0168e5af:
            vector_options._M_h._M_buckets = (__buckets_ptr)0x0;
            if (_Var11._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)((long)((_Var11._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                          + 8))();
              if (vector_options._M_h._M_buckets != (__buckets_ptr)0x0) {
                (*(code *)(*vector_options._M_h._M_buckets)[1]._M_nxt)();
              }
            }
            vector_options._M_h._M_buckets = (__buckets_ptr)0x0;
            Value::~Value((Value *)local_b8);
          }
        }
        else {
          bVar4 = ::std::operator==(&lower_name,"provider");
          if (bVar4) {
            optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
            TransformExpression((Transformer *)local_b8,
                                (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
            uVar3 = local_b8._0_8_;
            local_b8._0_8_ = (Transformer *)0x0;
            _Var11._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_00->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)uVar3;
            if (_Var11._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
              if ((Transformer *)local_b8._0_8_ != (Transformer *)0x0) {
                (*((BaseExpression *)local_b8._0_8_)->_vptr_BaseExpression[1])();
              }
            }
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_00);
            if ((pPVar7->super_BaseExpression).type == COLUMN_REF) {
              pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator*(this_00);
              GetConstantExpressionValue((Value *)local_b8,pPVar8);
              make_uniq<duckdb::ConstantExpression,duckdb::Value>
                        ((duckdb *)&vector_options,(Value *)local_b8);
              _Var11._M_head_impl =
                   (this_00->
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (this_00->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (ParsedExpression *)vector_options._M_h._M_buckets;
              goto LAB_0168e5af;
            }
          }
          else {
            vector_options._M_h._M_buckets = &vector_options._M_h._M_single_bucket;
            vector_options._M_h._M_bucket_count = 1;
            vector_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            vector_options._M_h._M_element_count = 0;
            vector_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            vector_options._M_h._M_rehash_policy._M_next_resize = 0;
            vector_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
            iVar9 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_f8._M_nxt,&lower_name);
            if (iVar9.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              this_02 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)local_b8,
                         "Duplicate query param found while parsing create secret: \'%s\'",
                         (allocator *)local_120);
              ::std::__cxx11::string::string((string *)&local_70,(string *)&lower_name);
              BinderException::BinderException<std::__cxx11::string>
                        (this_02,(string *)local_b8,&local_70);
              __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
            TransformExpression((Transformer *)local_120,
                                (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)local_120);
            if ((pPVar7->super_BaseExpression).type == COLUMN_REF) {
              pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)local_120);
              GetConstantExpressionValue((Value *)local_b8,pPVar8);
              make_uniq<duckdb::ConstantExpression,duckdb::Value>
                        ((duckdb *)&local_100,(Value *)local_b8);
              pTVar2 = local_100;
              auVar1 = local_120;
              local_100 = (Transformer *)0x0;
              local_120 = (undefined1  [8])pTVar2;
              if (auVar1 != (undefined1  [8])0x0) {
                (*((BaseExpression *)auVar1)->_vptr_BaseExpression[1])();
                if (local_100 != (Transformer *)0x0) {
                  (**(code **)(*(long *)local_100 + 8))();
                }
              }
              local_100 = (Transformer *)0x0;
              Value::~Value((Value *)local_b8);
            }
            pmVar10 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_f8._M_nxt,&lower_name);
            auVar1 = local_120;
            local_120 = (undefined1  [8])0x0;
            _Var11._M_head_impl =
                 (pmVar10->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pmVar10->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)auVar1;
            if (_Var11._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
            }
            if (local_120 != (undefined1  [8])0x0) {
              (*((BaseExpression *)local_120)->_vptr_BaseExpression[1])();
            }
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&vector_options._M_h);
          }
        }
      }
      ::std::__cxx11::string::~string((string *)&lower_name);
    }
  }
  return;
}

Assistant:

void Transformer::TransformCreateSecretOptions(CreateSecretInfo &info,
                                               optional_ptr<duckdb_libpgquery::PGList> options) {
	if (!options) {
		return;
	}

	duckdb_libpgquery::PGListCell *cell;

	// iterate over each option
	for_each_cell(cell, options->head) {
		auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
		auto lower_name = StringUtil::Lower(def_elem->defname);
		if (lower_name == "scope") {
			info.scope = TransformExpression(def_elem->arg);
			continue;
		}
		if (lower_name == "type") {
			info.type = TransformExpression(def_elem->arg);
			if (info.type->type == ExpressionType::COLUMN_REF) {
				info.type = make_uniq<ConstantExpression>(GetConstantExpressionValue(*info.type));
			}
			continue;
		}
		if (lower_name == "provider") {
			info.provider = TransformExpression(def_elem->arg);
			if (info.provider->type == ExpressionType::COLUMN_REF) {
				info.provider = make_uniq<ConstantExpression>(GetConstantExpressionValue(*info.provider));
			}
			continue;
		}

		// All the other options end up in the generic
		case_insensitive_map_t<vector<ParsedExpression>> vector_options;

		if (info.options.find(lower_name) != info.options.end()) {
			throw BinderException("Duplicate query param found while parsing create secret: '%s'", lower_name);
		}

		auto expr = TransformExpression(def_elem->arg);
		if (expr->type == ExpressionType::COLUMN_REF) {
			expr = make_uniq<ConstantExpression>(GetConstantExpressionValue(*expr));
		}
		info.options[lower_name] = std::move(expr);
	}
}